

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::stringOps::removeChars_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view source,string_view remchars)

{
  char *pcVar1;
  value_type *__value;
  value_type local_39;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  __value = (value_type *)source._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  local_38.container = __return_storage_ptr__;
  for (; this != (stringOps *)0x0; this = this + -1) {
    local_39 = *__value;
    pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (remchars._M_len,source._M_str + remchars._M_len,&local_39);
    if (pcVar1 == source._M_str + remchars._M_len) {
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_38,__value);
    }
    __value = __value + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string removeChars(std::string_view source, std::string_view remchars)
    {
        std::string result;
        result.reserve(source.length());
        std::remove_copy_if(
            source.begin(),
            source.end(),
            std::back_inserter(result),
            [remchars](char input) {
                return (
                    std::find(remchars.begin(), remchars.end(), input) !=
                    remchars.end());
            });
        return result;
    }